

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * GetFallbackWindowNameForWindowingList(ImGuiWindow *window)

{
  int iVar1;
  undefined8 *in_RDI;
  char *local_8;
  
  if ((*(uint *)((long)in_RDI + 0xc) & 0x4000000) == 0) {
    if (((*(uint *)((long)in_RDI + 0xc) & 0x400) != 0) &&
       (iVar1 = strcmp((char *)*in_RDI,"##MainMenuBar"), iVar1 == 0)) {
      return "(Main menu bar)";
    }
    if (in_RDI[0x83] == 0) {
      local_8 = "(Untitled)";
    }
    else {
      local_8 = "(Dock node)";
    }
  }
  else {
    local_8 = "(Popup)";
  }
  return local_8;
}

Assistant:

static const char* GetFallbackWindowNameForWindowingList(ImGuiWindow* window)
{
    if (window->Flags & ImGuiWindowFlags_Popup)
        return "(Popup)";
    if ((window->Flags & ImGuiWindowFlags_MenuBar) && strcmp(window->Name, "##MainMenuBar") == 0)
        return "(Main menu bar)";
    if (window->DockNodeAsHost)
        return "(Dock node)";
    return "(Untitled)";
}